

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint lodepng_convert(uchar *out,uchar *in,LodePNGColorMode *mode_out,LodePNGColorMode *mode_in,
                    uint w,uint h)

{
  int iVar1;
  uint uVar2;
  size_t sVar3;
  uchar local_104;
  uchar local_103;
  uchar local_102;
  uchar local_101;
  uint error;
  uchar a_1;
  uchar b_1;
  uchar g_1;
  uchar r_1;
  unsigned_short a;
  unsigned_short b;
  unsigned_short g;
  unsigned_short r;
  uchar *p;
  size_t palsize;
  uchar *palette;
  size_t palettesize;
  size_t numbytes;
  size_t numpixels;
  ColorTree tree;
  size_t i;
  uint h_local;
  uint w_local;
  LodePNGColorMode *mode_in_local;
  LodePNGColorMode *mode_out_local;
  uchar *in_local;
  uchar *out_local;
  
  numbytes = (size_t)(w * h);
  iVar1 = lodepng_color_mode_equal(mode_out,mode_in);
  if (iVar1 == 0) {
    if (mode_out->colortype == LCT_PALETTE) {
      palette = (uchar *)mode_out->palettesize;
      palsize = (size_t)mode_out->palette;
      p = (uchar *)(ulong)(uint)(1 << ((byte)mode_out->bitdepth & 0x1f));
      if (palette == (uchar *)0x0) {
        palette = (uchar *)mode_in->palettesize;
        palsize = (size_t)mode_in->palette;
      }
      if (palette < p) {
        p = palette;
      }
      color_tree_init((ColorTree *)&numpixels);
      tree.index = 0;
      tree._132_4_ = 0;
      for (; (uchar *)tree._128_8_ != p; tree._128_8_ = tree._128_8_ + 1) {
        _a = (uchar *)(palsize + tree._128_8_ * 4);
        color_tree_add((ColorTree *)&numpixels,*_a,_a[1],_a[2],_a[3],tree.index);
      }
    }
    if ((mode_in->bitdepth == 0x10) && (mode_out->bitdepth == 0x10)) {
      tree.index = 0;
      tree._132_4_ = 0;
      for (; tree._128_8_ != numbytes; tree._128_8_ = tree._128_8_ + 1) {
        _g_1 = 0;
        _a_1 = 0;
        error._2_2_ = 0;
        error._0_2_ = 0;
        getPixelColorRGBA16((unsigned_short *)&g_1,(unsigned_short *)&a_1,
                            (unsigned_short *)((long)&error + 2),(unsigned_short *)&error,in,
                            tree._128_8_,mode_in);
        rgba16ToPixel(out,tree._128_8_,mode_out,_g_1,_a_1,error._2_2_,(unsigned_short)error);
      }
    }
    else if ((mode_out->bitdepth == 8) && (mode_out->colortype == LCT_RGBA)) {
      getPixelColorsRGBA8(out,numbytes,1,in,mode_in);
    }
    else if ((mode_out->bitdepth == 8) && (mode_out->colortype == LCT_RGB)) {
      getPixelColorsRGBA8(out,numbytes,0,in,mode_in);
    }
    else {
      local_101 = '\0';
      local_102 = '\0';
      local_103 = '\0';
      local_104 = '\0';
      tree.index = 0;
      tree._132_4_ = 0;
      for (; tree._128_8_ != numbytes; tree._128_8_ = tree._128_8_ + 1) {
        getPixelColorRGBA8(&local_101,&local_102,&local_103,&local_104,in,tree._128_8_,mode_in);
        uVar2 = rgba8ToPixel(out,tree._128_8_,mode_out,(ColorTree *)&numpixels,local_101,local_102,
                             local_103,local_104);
        if (uVar2 != 0) {
          return uVar2;
        }
      }
    }
    if (mode_out->colortype == LCT_PALETTE) {
      color_tree_cleanup((ColorTree *)&numpixels);
    }
  }
  else {
    sVar3 = lodepng_get_raw_size(w,h,mode_in);
    tree.index = 0;
    tree._132_4_ = 0;
    for (; tree._128_8_ != sVar3; tree._128_8_ = tree._128_8_ + 1) {
      out[tree._128_8_] = in[tree._128_8_];
    }
  }
  return 0;
}

Assistant:

unsigned lodepng_convert(unsigned char* out, const unsigned char* in,
                         const LodePNGColorMode* mode_out, const LodePNGColorMode* mode_in,
                         unsigned w, unsigned h)
{
  size_t i;
  ColorTree tree;
  size_t numpixels = w * h;

  if(lodepng_color_mode_equal(mode_out, mode_in))
  {
    size_t numbytes = lodepng_get_raw_size(w, h, mode_in);
    for(i = 0; i != numbytes; ++i) out[i] = in[i];
    return 0;
  }

  if(mode_out->colortype == LCT_PALETTE)
  {
    size_t palettesize = mode_out->palettesize;
    const unsigned char* palette = mode_out->palette;
    size_t palsize = 1u << mode_out->bitdepth;
    /*if the user specified output palette but did not give the values, assume
    they want the values of the input color type (assuming that one is palette).
    Note that we never create a new palette ourselves.*/
    if(palettesize == 0)
    {
      palettesize = mode_in->palettesize;
      palette = mode_in->palette;
    }
    if(palettesize < palsize) palsize = palettesize;
    color_tree_init(&tree);
    for(i = 0; i != palsize; ++i)
    {
      const unsigned char* p = &palette[i * 4];
      color_tree_add(&tree, p[0], p[1], p[2], p[3], i);
    }
  }

  if(mode_in->bitdepth == 16 && mode_out->bitdepth == 16)
  {
    for(i = 0; i != numpixels; ++i)
    {
      unsigned short r = 0, g = 0, b = 0, a = 0;
      getPixelColorRGBA16(&r, &g, &b, &a, in, i, mode_in);
      rgba16ToPixel(out, i, mode_out, r, g, b, a);
    }
  }
  else if(mode_out->bitdepth == 8 && mode_out->colortype == LCT_RGBA)
  {
    getPixelColorsRGBA8(out, numpixels, 1, in, mode_in);
  }
  else if(mode_out->bitdepth == 8 && mode_out->colortype == LCT_RGB)
  {
    getPixelColorsRGBA8(out, numpixels, 0, in, mode_in);
  }
  else
  {
    unsigned char r = 0, g = 0, b = 0, a = 0;
    for(i = 0; i != numpixels; ++i)
    {
      getPixelColorRGBA8(&r, &g, &b, &a, in, i, mode_in);
      CERROR_TRY_RETURN(rgba8ToPixel(out, i, mode_out, &tree, r, g, b, a));
    }
  }

  if(mode_out->colortype == LCT_PALETTE)
  {
    color_tree_cleanup(&tree);
  }

  return 0; /*no error*/
}